

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O1

LispPTR N_OP_putbasebyte(LispPTR base_addr,LispPTR byteoffset,LispPTR tos)

{
  uint uVar1;
  
  if ((tos & 0xfffff00) != 0xe0000) {
    MachineState.tosvalue = tos;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((byteoffset & 0xfff0000) == 0xf0000) {
    uVar1 = byteoffset | 0xffff0000;
  }
  else {
    if ((byteoffset & 0xfff0000) != 0xe0000) {
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    uVar1 = byteoffset & 0xffff;
  }
  *(char *)((long)Lisp_world + (ulong)uVar1 + (ulong)(base_addr & 0xfffffff) * 2 ^ 3) = (char)tos;
  return tos;
}

Assistant:

LispPTR N_OP_putbasebyte(LispPTR base_addr, LispPTR byteoffset, LispPTR tos) {
  if (((SEGMASK & tos) != S_POSITIVE) || ((unsigned short)tos >= 256)) ERROR_EXIT(tos);
  switch ((SEGMASK & byteoffset)) {
    case S_POSITIVE: byteoffset &= 0x0000FFFF; break;
    case S_NEGATIVE: byteoffset |= 0xFFFF0000; break;
    default:
      /* ucode and ufn don't handle displacement not smallp */
      ERROR_EXIT(tos);
  } /* end switch */
  GETBYTE(((char *)NativeAligned2FromLAddr(POINTERMASK & base_addr)) + byteoffset) = 0xFF & tos;
  return (tos);
}